

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

CService * ResolveService(CService *__return_storage_ptr__,string *ip,uint16_t port)

{
  DNSLookupFn dns_lookup_function;
  _Any_data *this;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  readonly_property<bool> in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  shared_count sStack_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  _Any_data local_d8;
  code *local_c8;
  undefined1 local_b2 [2];
  undefined1 local_b0 [24];
  string *local_98;
  uint16_t local_90;
  string local_88;
  _Storage<CService,_false> local_68;
  char local_40;
  CService *local_38;
  
  local_38 = *(CService **)(in_FS_OFFSET + 0x28);
  this = &local_d8;
  local_b2 = (undefined1  [2])port;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)this,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffedc;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffed8;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffee0;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffee8;
  dns_lookup_function._M_invoker._0_1_ = in_stack_fffffffffffffef0.super_class_property<bool>.value;
  dns_lookup_function._M_invoker._1_7_ = in_stack_fffffffffffffef1;
  Lookup((optional<CService> *)&local_68._M_value,ip,port,false,dns_lookup_function);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)this;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  sStack_100.pi_ = (sp_counted_base *)0x0;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&local_88,(tinyformat *)"failed to resolve: %s:%i",(char *)ip,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b2,
             (unsigned_short *)this->_M_pod_data);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_01388e08;
  local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_88;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xfffffffffffffef0,(lazy_ostream *)local_b0,1,1,WARN,0xe30a79
             ,(size_t)&stack0xfffffffffffffee0,0x2d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&sStack_100);
  CService::CService((CService *)local_b0);
  if (local_40 == '\x01') {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)__return_storage_ptr__,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_68._M_value);
    (__return_storage_ptr__->super_CNetAddr).m_net = local_68._24_4_;
    (__return_storage_ptr__->super_CNetAddr).m_scope_id =
         local_68._M_value.super_CNetAddr.m_scope_id;
    __return_storage_ptr__->port = local_68._M_value.port;
    if (0x10 < (uint)local_b0._16_4_) {
      free((void *)local_b0._0_8_);
    }
  }
  else {
    (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect =
         (char *)local_b0._0_8_;
    *(ulong *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) =
         CONCAT71(local_b0._9_7_,local_b0[8]);
    (__return_storage_ptr__->super_CNetAddr).m_addr._size = local_b0._16_4_;
    local_b0._16_8_ = local_b0._16_8_ & 0xffffffff00000000;
    *(string **)&(__return_storage_ptr__->super_CNetAddr).m_net = local_98;
    __return_storage_ptr__->port = local_90;
  }
  if ((local_40 == '\x01') &&
     (local_40 = '\0', 0x10 < local_68._M_value.super_CNetAddr.m_addr._size)) {
    free((void *)local_68._0_8_);
  }
  if (*(CService **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(CService **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static CService ResolveService(const std::string& ip, uint16_t port = 0)
{
    const std::optional<CService> serv{Lookup(ip, port, false)};
    BOOST_CHECK_MESSAGE(serv.has_value(), strprintf("failed to resolve: %s:%i", ip, port));
    return serv.value_or(CService{});
}